

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_jpeg.h
# Opt level: O0

int tje_encode_to_file_at_quality
              (char *dest_path,int quality,int width,int height,int num_components,uchar *src_data)

{
  int iVar1;
  FILE *__stream;
  char *in_RDI;
  int result;
  FILE *fd;
  int in_stack_000010c0;
  int in_stack_000010c4;
  int in_stack_000010c8;
  int in_stack_000010cc;
  void *in_stack_000010d0;
  tje_write_func *in_stack_000010d8;
  uchar *in_stack_000010f0;
  uint local_4;
  
  __stream = fopen(in_RDI,"wb");
  if (__stream == (FILE *)0x0) {
    local_4 = 0;
  }
  else {
    local_4 = tje_encode_with_func
                        (in_stack_000010d8,in_stack_000010d0,in_stack_000010cc,in_stack_000010c8,
                         in_stack_000010c4,in_stack_000010c0,in_stack_000010f0);
    iVar1 = fclose(__stream);
    local_4 = iVar1 == 0 | local_4;
  }
  return local_4;
}

Assistant:

int tje_encode_to_file_at_quality(const char* dest_path,
                                  const int quality,
                                  const int width,
                                  const int height,
                                  const int num_components,
                                  const unsigned char* src_data)
{
    FILE* fd = fopen(dest_path, "wb");
    if (!fd) {
        tje_log("Could not open file for writing.");
        return 0;
    }

    int result = tje_encode_with_func(tjei_stdlib_func, fd,
                                      quality, width, height, num_components, src_data);

    result |= 0 == fclose(fd);

    return result;
}